

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O0

void av1_k_means_dim1(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int max_itr)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  uint8_t *in_RDX;
  int16_t *in_RSI;
  int16_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int64_t prev_dist;
  int64_t this_dist;
  int best_l;
  int prev_l;
  int l;
  int i;
  uint8_t *meta_indices [2];
  int16_t *meta_centroids [2];
  uint8_t indices_tmp [4096];
  int16_t centroids_tmp [8];
  long local_1070;
  uint local_1068;
  uint local_1064;
  uint local_1060;
  int local_105c;
  undefined1 *local_1058 [4];
  undefined1 local_1038 [32];
  int in_stack_ffffffffffffefe8;
  int in_stack_ffffffffffffefec;
  uint8_t *in_stack_ffffffffffffeff0;
  int16_t *in_stack_ffffffffffffeff8;
  int16_t *in_stack_fffffffffffff000;
  undefined1 local_38 [20];
  int local_24;
  int local_20;
  int local_1c;
  uint8_t *local_18;
  int16_t *local_10;
  int16_t *local_8;
  
  local_1058[3] = local_38;
  local_1058[1] = local_1038;
  local_1060 = 0;
  local_1068 = 0;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (*av1_calc_indices_dim1)(in_RDI,in_RSI,in_RDX,&local_1070,in_ECX,in_R8D);
  local_105c = 0;
  do {
    lVar1 = local_1070;
    if (local_24 <= local_105c) {
LAB_0026cb12:
      if (local_105c == local_24) {
        local_1068 = local_1060;
      }
      if (local_1068 != 0) {
        memcpy(local_10,local_1058[3],(long)local_20 << 1);
        memcpy(local_18,local_1058[1],(long)local_1c);
      }
      return;
    }
    local_1064 = local_1060;
    local_1060 = (uint)(local_1060 != 1);
    calc_centroids_dim1(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,
                        in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,
                        in_stack_ffffffffffffefe8);
    iVar2 = memcmp(local_1058[(long)(int)local_1060 + 2],local_1058[(long)(int)local_1064 + 2],
                   (long)local_20 << 1);
    if (iVar2 == 0) goto LAB_0026cb12;
    (*av1_calc_indices_dim1)
              (local_8,(int16_t *)local_1058[(long)(int)local_1060 + 2],local_1058[(int)local_1060],
               &local_1070,local_1c,local_20);
    if (lVar1 < local_1070) {
      local_1068 = local_1064;
      goto LAB_0026cb12;
    }
    local_105c = local_105c + 1;
  } while( true );
}

Assistant:

void RENAME(av1_k_means)(const int16_t *data, int16_t *centroids,
                         uint8_t *indices, int n, int k, int max_itr) {
  int16_t centroids_tmp[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  uint8_t indices_tmp[MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT];
  int16_t *meta_centroids[2] = { centroids, centroids_tmp };
  uint8_t *meta_indices[2] = { indices, indices_tmp };
  int i, l = 0, prev_l, best_l = 0;
  int64_t this_dist;

  assert(n <= MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT);

#if AV1_K_MEANS_DIM == 1
  av1_calc_indices_dim1(data, centroids, indices, &this_dist, n, k);
#else
  av1_calc_indices_dim2(data, centroids, indices, &this_dist, n, k);
#endif

  for (i = 0; i < max_itr; ++i) {
    const int64_t prev_dist = this_dist;
    prev_l = l;
    l = (l == 1) ? 0 : 1;

    RENAME(calc_centroids)(data, meta_centroids[l], meta_indices[prev_l], n, k);
    if (!memcmp(meta_centroids[l], meta_centroids[prev_l],
                sizeof(centroids[0]) * k * AV1_K_MEANS_DIM)) {
      break;
    }
#if AV1_K_MEANS_DIM == 1
    av1_calc_indices_dim1(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#else
    av1_calc_indices_dim2(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#endif

    if (this_dist > prev_dist) {
      best_l = prev_l;
      break;
    }
  }
  if (i == max_itr) best_l = l;
  if (best_l != 0) {
    memcpy(centroids, meta_centroids[1],
           sizeof(centroids[0]) * k * AV1_K_MEANS_DIM);
    memcpy(indices, meta_indices[1], sizeof(indices[0]) * n);
  }
}